

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

MempoolAcceptResult * __thiscall
anon_unknown.dwarf_12a34eb::MemPoolAccept::AcceptSingleTransaction
          (MempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,CTransactionRef *ptx,
          ATMPArgs *args)

{
  setEntries *all_conflicts;
  CAmount *pCVar1;
  size_t *psVar2;
  _Alloc_hider _Var3;
  undefined4 uVar4;
  element_type *peVar5;
  CTransaction *pCVar6;
  long lVar7;
  CTxMemPool *pCVar8;
  uint64_t mempool_sequence;
  ValidationSignals *this_00;
  TxValidationState state;
  TxValidationState state_00;
  TxValidationState state_01;
  TxValidationState state_02;
  TxValidationState state_03;
  TxValidationState state_04;
  TxValidationState state_05;
  TxValidationState state_06;
  undefined8 uVar9;
  CTransactionRef *pCVar10;
  Txid *txid;
  bool bVar11;
  bool bVar12;
  int64_t iVar13;
  _Base_ptr p_Var14;
  Logger *this_01;
  Workspace *extraout_RDX;
  Workspace *extraout_RDX_00;
  Workspace *extraout_RDX_01;
  Workspace *extraout_RDX_02;
  Workspace *extraout_RDX_03;
  Workspace *extraout_RDX_04;
  Workspace *extraout_RDX_05;
  Workspace *extraout_RDX_06;
  Workspace *extraout_RDX_07;
  Workspace *extraout_RDX_08;
  Workspace *extraout_RDX_09;
  Workspace *extraout_RDX_10;
  Workspace *extraout_RDX_11;
  Workspace *extraout_RDX_12;
  Workspace *ws_00;
  Workspace *extraout_RDX_13;
  Workspace *extraout_RDX_14;
  Workspace *extraout_RDX_15;
  Workspace *extraout_RDX_16;
  Workspace *ws_01;
  long *plVar15;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  initializer_list<transaction_identifier<true>_> __l;
  initializer_list<transaction_identifier<true>_> __l_00;
  uint local_578;
  undefined4 uStack_574;
  undefined1 local_568;
  undefined7 uStack_567;
  Txid *local_560;
  CFeeRate local_558;
  CFeeRate local_550;
  CFeeRate local_548;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> single_wtxid;
  char **local_528;
  CFeeRate effective_feerate;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_string;
  ValidationState<TxValidationResult> local_4d8;
  undefined1 local_490 [8];
  long *local_488;
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  undefined1 local_448 [8];
  long *local_440;
  long local_430 [2];
  long *local_420 [2];
  long local_410 [2];
  undefined1 local_400 [8];
  long *local_3f8;
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  undefined1 local_3b8 [8];
  long *local_3b0;
  long local_3a0 [2];
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370 [8];
  long *local_368;
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  undefined1 local_328 [8];
  long *local_320;
  long local_310 [2];
  long *local_300 [2];
  long local_2f0 [2];
  undefined1 local_2e0 [8];
  long *local_2d8;
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  Workspace ws;
  string local_58;
  MempoolAcceptResult *local_38;
  
  local_38 = *(MempoolAcceptResult **)(in_FS_OFFSET + 0x28);
  criticalblock7.super_unique_lock._M_device = &(this->m_pool->cs).super_recursive_mutex;
  criticalblock7.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock7.super_unique_lock);
  ws.m_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ws.m_conflicts._M_t._M_impl.super__Rb_tree_header._M_header;
  ws.m_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ws.m_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ws.m_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ws.m_iters_conflicting._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ws.m_iters_conflicting._M_t._M_impl.super__Rb_tree_header._M_header;
  ws.m_iters_conflicting._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ws.m_iters_conflicting._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ws.m_iters_conflicting._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ws.m_ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ws.m_ancestors._M_t._M_impl.super__Rb_tree_header._M_header;
  ws.m_ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ws.m_ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ws.m_package_feerate.nSatoshisPerK = 0;
  ws.m_ancestors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ws.m_entry._M_t.super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t
  .super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
  super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl =
       (__uniq_ptr_data<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>,_true,_true>)
       (__uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>)0x0;
  ws.m_sibling_eviction = false;
  peVar5 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  ws.m_hash = &peVar5->hash;
  ws.m_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  ws.m_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
       '\0';
  ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
  ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] =
       '\0';
  ws.m_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ws.m_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ws.m_iters_conflicting._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ws.m_iters_conflicting._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ws.m_ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ws.m_ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ws.m_ptx = ptx;
  memset(&ws.m_precomputed_txdata,0,0x102);
  ws.m_precomputed_txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ws.m_precomputed_txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  ws.m_precomputed_txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
  _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  ws.m_precomputed_txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  ws.m_precomputed_txdata._281_8_ = 0;
  err_string.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (_Alloc_hider)
       *(undefined8 *)(peVar5->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  err_string.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       *(undefined8 *)
        ((long)(peVar5->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  err_string.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ =
       *(undefined8 *)
        ((long)(peVar5->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  err_string.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ =
       *(undefined8 *)
        ((long)(peVar5->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  __l._M_len = 1;
  __l._M_array = (iterator)&err_string;
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            (&single_wtxid,__l,(allocator_type *)&local_58);
  bVar11 = PreChecks(this,args,&ws);
  if (bVar11) {
    ws_01 = extraout_RDX;
    if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
        super__Optional_payload_base<CFeeRate>._M_engaged == true) {
      CFeeRate::CFeeRate((CFeeRate *)&err_string,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
      if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
          super__Optional_payload_base<CFeeRate>._M_engaged == false) {
        if (*(MempoolAcceptResult **)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
        goto LAB_003ebde1;
      }
      ws_01 = extraout_RDX_00;
      if ((long)(args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
                super__Optional_payload_base<CFeeRate>._M_payload <
          (long)err_string.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p) {
        _Var3._M_p = (pointer)((long)&err_string.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload + 0x10);
        err_string.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&err_string,"max feerate exceeded","");
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
        ValidationState<TxValidationResult>::Invalid
                  (&ws.m_state.super_ValidationState<TxValidationResult>,TX_MEMPOOL_POLICY,
                   (string *)&err_string,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var3._M_p) {
          operator_delete((void *)err_string.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          err_string.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        local_370._0_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_mode;
        local_370._4_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_result;
        local_368 = local_358;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_368,
                   ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                   _M_p,ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_dataplus._M_p +
                        ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_string_length);
        local_348[0] = local_338;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_348,
                   ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                   _M_p,ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_dataplus._M_p +
                        ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_string_length);
        state.super_ValidationState<TxValidationResult>.m_result = uStack_574;
        state.super_ValidationState<TxValidationResult>.m_mode = local_578;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
             local_568;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
             uStack_567;
        state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)local_560;
        state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             local_558.nSatoshisPerK;
        state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)local_550.nSatoshisPerK;
        state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             local_548.nSatoshisPerK;
        state.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity =
             (size_type)
             single_wtxid.
             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
             single_wtxid.
             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        MempoolAcceptResult::Failure(__return_storage_ptr__,state);
        if (local_348[0] != local_338) {
          operator_delete(local_348[0],local_338[0] + 1);
        }
        local_310[0] = local_358[0];
        plVar15 = local_368;
        if (local_368 != local_358) goto LAB_003eb7c4;
        goto LAB_003eb7cc;
      }
    }
    txid = ws.m_hash;
    if ((this->m_subpackage).m_rbf == true) {
      pCVar6 = ((ws.m_ptx)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_568 = SUB81(pCVar6,0);
      uStack_567 = (undefined7)((ulong)pCVar6 >> 8);
      local_560 = ws.m_hash;
      CFeeRate::CFeeRate(&effective_feerate,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
      PaysMoreThanConflicts_abi_cxx11_
                (&err_string,&ws.m_iters_conflicting,effective_feerate,&txid->m_wrapped);
      bVar11 = err_string.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_engaged;
      ws_01 = extraout_RDX_01;
      if (err_string.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        local_528 = (char **)0x86c516;
        if (ws.m_sibling_eviction != false) {
          local_528 = (char **)0x811059;
        }
        tinyformat::format<char_const*>
                  (&local_58,(tinyformat *)"insufficient fee%s",(char *)&local_528,local_528);
        bVar12 = ValidationState<TxValidationResult>::Invalid
                           (&ws.m_state.super_ValidationState<TxValidationResult>,TX_RECONSIDERABLE,
                            &local_58,(string *)&err_string);
        local_578 = CONCAT31(local_578._1_3_,bVar12);
        ws_01 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          ws_01 = extraout_RDX_03;
        }
      }
      if (((err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged & 1U) != 0) &&
         (err_string.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_4_ = err_string.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_4_ & 0xffffff00,
         err_string.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_dataplus._M_p !=
         (pointer)((long)&err_string.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10))) {
        operator_delete((void *)err_string.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                        err_string.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
        ws_01 = extraout_RDX_04;
      }
      if (bVar11 == false) {
        all_conflicts = &(this->m_subpackage).m_all_conflicts;
        GetEntriesForConflicts_abi_cxx11_
                  (&err_string,pCVar6,this->m_pool,&ws.m_iters_conflicting,all_conflicts);
        bVar11 = err_string.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_engaged;
        ws_01 = extraout_RDX_05;
        if (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          local_528 = (char **)0x86c516;
          if (ws.m_sibling_eviction != false) {
            local_528 = (char **)0x811059;
          }
          tinyformat::format<char_const*>
                    (&local_58,(tinyformat *)"too many potential replacements%s",(char *)&local_528,
                     local_528);
          bVar12 = ValidationState<TxValidationResult>::Invalid
                             (&ws.m_state.super_ValidationState<TxValidationResult>,
                              TX_MEMPOOL_POLICY,&local_58,(string *)&err_string);
          local_578 = CONCAT31(local_578._1_3_,bVar12);
          ws_01 = extraout_RDX_06;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            ws_01 = extraout_RDX_07;
          }
        }
        if (((err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged & 1U) != 0) &&
           (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_4_ = err_string.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._32_4_ & 0xffffff00,
           err_string.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus._M_p !=
           (pointer)((long)&err_string.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10))) {
          operator_delete((void *)err_string.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          err_string.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
          ws_01 = extraout_RDX_08;
        }
        if (bVar11 != false) goto LAB_003eb166;
        HasNoNewUnconfirmed_abi_cxx11_(&err_string,pCVar6,this->m_pool,all_conflicts);
        bVar11 = err_string.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_engaged;
        ws_01 = extraout_RDX_09;
        if (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          local_528 = (char **)0x86c516;
          if (ws.m_sibling_eviction != false) {
            local_528 = (char **)0x811059;
          }
          tinyformat::format<char_const*>
                    (&local_58,(tinyformat *)"replacement-adds-unconfirmed%s",(char *)&local_528,
                     local_528);
          bVar12 = ValidationState<TxValidationResult>::Invalid
                             (&ws.m_state.super_ValidationState<TxValidationResult>,
                              TX_MEMPOOL_POLICY,&local_58,(string *)&err_string);
          local_578 = CONCAT31(local_578._1_3_,bVar12);
          ws_01 = extraout_RDX_10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            ws_01 = extraout_RDX_11;
          }
        }
        if (((err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged & 1U) != 0) &&
           (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_4_ = err_string.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._32_4_ & 0xffffff00,
           err_string.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus._M_p !=
           (pointer)((long)&err_string.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10))) {
          operator_delete((void *)err_string.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          err_string.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
          ws_01 = extraout_RDX_12;
        }
        if (bVar11 != false) goto LAB_003eb166;
        for (p_Var14 = (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var14 !=
            &(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header;
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14)) {
          lVar7 = *(long *)(p_Var14 + 1);
          pCVar1 = &(this->m_subpackage).m_conflicting_fees;
          *pCVar1 = *pCVar1 + *(long *)(lVar7 + 0xa8);
          iVar13 = GetVirtualTransactionSize
                             ((long)*(int *)(lVar7 + 0x78),*(int64_t *)(lVar7 + 0xa0),nBytesPerSigOp
                             );
          psVar2 = &(this->m_subpackage).m_conflicting_size;
          *psVar2 = *psVar2 + (long)(int)iVar13;
        }
        PaysForRBF_abi_cxx11_
                  (&err_string,(this->m_subpackage).m_conflicting_fees,ws.m_modified_fees,
                   CONCAT44(ws.m_vsize._4_4_,(uint32_t)ws.m_vsize),
                   (CFeeRate)(this->m_pool->m_opts).incremental_relay_feerate.nSatoshisPerK,
                   &txid->m_wrapped);
        bVar11 = err_string.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_engaged;
        ws_01 = extraout_RDX_13;
        if (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged != false) {
          local_528 = (char **)0x86c516;
          if (ws.m_sibling_eviction != false) {
            local_528 = (char **)0x811059;
          }
          tinyformat::format<char_const*>
                    (&local_58,(tinyformat *)"insufficient fee%s",(char *)&local_528,local_528);
          bVar12 = ValidationState<TxValidationResult>::Invalid
                             (&ws.m_state.super_ValidationState<TxValidationResult>,
                              TX_RECONSIDERABLE,&local_58,(string *)&err_string);
          local_578 = CONCAT31(local_578._1_3_,bVar12);
          ws_01 = extraout_RDX_14;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            ws_01 = extraout_RDX_15;
          }
        }
        if (((err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged & 1U) != 0) &&
           (err_string.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_4_ = err_string.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._32_4_ & 0xffffff00,
           err_string.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus._M_p !=
           (pointer)((long)&err_string.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10))) {
          operator_delete((void *)err_string.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          err_string.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
          ws_01 = extraout_RDX_16;
        }
        if ((((byte)local_578 | ~bVar11) & 1) != 0) goto LAB_003eb170;
      }
      else {
LAB_003eb166:
        if ((local_578 & 1) != 0) goto LAB_003eb170;
      }
      if (ws.m_state.super_ValidationState<TxValidationResult>.m_result == TX_RECONSIDERABLE) {
        local_3b8._0_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_mode;
        local_3b8._4_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_result;
        local_3b0 = local_3a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b0,
                   ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                   _M_p,ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_dataplus._M_p +
                        ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_string_length);
        local_390[0] = local_380;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_390,
                   ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                   _M_p,ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_dataplus._M_p +
                        ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_string_length);
        CFeeRate::CFeeRate(&local_550,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
        state_04.super_ValidationState<TxValidationResult>.m_result = uStack_574;
        state_04.super_ValidationState<TxValidationResult>.m_mode = local_578;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
             local_568;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
             uStack_567;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)txid;
        state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             local_558.nSatoshisPerK;
        state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)local_550.nSatoshisPerK;
        state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             local_548.nSatoshisPerK;
        state_04.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity =
             (size_type)
             single_wtxid.
             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        state_04.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
             single_wtxid.
             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        MempoolAcceptResult::FeeFailure
                  (__return_storage_ptr__,state_04,(CFeeRate)local_3b8,
                   (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)local_550.nSatoshisPerK);
        if (local_390[0] != local_380) {
          operator_delete(local_390[0],local_380[0] + 1);
        }
        local_310[0] = local_3a0[0];
        plVar15 = local_3b0;
        if (local_3b0 != local_3a0) {
LAB_003eb7c4:
          operator_delete(plVar15,local_310[0] + 1);
        }
      }
      else {
        local_400._0_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_mode;
        local_400._4_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_result;
        local_3f8 = local_3e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f8,
                   ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                   _M_p,ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_dataplus._M_p +
                        ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_string_length);
        local_3d8[0] = local_3c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,
                   ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                   _M_p,ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_dataplus._M_p +
                        ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_string_length);
        state_05.super_ValidationState<TxValidationResult>.m_result = uStack_574;
        state_05.super_ValidationState<TxValidationResult>.m_mode = local_578;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
             local_568;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
             uStack_567;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)txid;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             local_558.nSatoshisPerK;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)local_550.nSatoshisPerK;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             local_548.nSatoshisPerK;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity =
             (size_type)
             single_wtxid.
             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
             single_wtxid.
             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        MempoolAcceptResult::Failure(__return_storage_ptr__,state_05);
        if (local_3d8[0] != local_3c8) {
          operator_delete(local_3d8[0],local_3c8[0] + 1);
        }
        local_310[0] = local_3e8[0];
        plVar15 = local_3f8;
        if (local_3f8 != local_3e8) goto LAB_003eb7c4;
      }
    }
    else {
LAB_003eb170:
      bVar11 = PolicyScriptChecks(this,(ATMPArgs *)&ws,ws_01);
      if (bVar11) {
        bVar11 = ConsensusScriptChecks(this,(ATMPArgs *)&ws,ws_00);
        if (bVar11) {
          CFeeRate::CFeeRate(&effective_feerate,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
          if (args->m_test_accept != true) {
            bVar11 = Finalize(this,args,&ws);
            pCVar10 = ws.m_ptx;
            if (!bVar11) {
              TxValidationState::TxValidationState((TxValidationState *)&local_4d8,&ws.m_state);
              CFeeRate::CFeeRate(&local_558,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
              peVar5 = ((ws.m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p =
                   (_Alloc_hider)
                   *(undefined8 *)
                    (peVar5->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length =
                   *(undefined8 *)
                    ((long)(peVar5->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 8);
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._16_8_ =
                   *(undefined8 *)
                    ((long)(peVar5->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x10);
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._24_8_ =
                   *(undefined8 *)
                    ((long)(peVar5->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x18);
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)&err_string;
              std::
              vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
              vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)&local_58,__l_00,(allocator_type *)&local_528);
              state_06.super_ValidationState<TxValidationResult>.m_result = uStack_574;
              state_06.super_ValidationState<TxValidationResult>.m_mode = local_578;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                   (pointer)__return_storage_ptr__;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
              _0_1_ = local_568;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
              _1_7_ = uStack_567;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity = (size_type)local_560;
              state_06.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                   local_558.nSatoshisPerK;
              state_06.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
                   (pointer)local_550.nSatoshisPerK;
              state_06.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
                   local_548.nSatoshisPerK;
              state_06.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
              _M_allocated_capacity =
                   (size_type)
                   single_wtxid.
                   super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              state_06.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                   single_wtxid.
                   super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              MempoolAcceptResult::FeeFailure
                        (__return_storage_ptr__,state_06,(CFeeRate)&local_4d8,
                         (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          *)local_558.nSatoshisPerK);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_58._M_dataplus._M_p,
                                local_58.field_2._M_allocated_capacity -
                                (long)local_58._M_dataplus._M_p);
              }
              ValidationState<TxValidationResult>::~ValidationState(&local_4d8);
              goto LAB_003eb7cc;
            }
            if ((this->m_pool->m_opts).signals != (ValidationSignals *)0x0) {
              pCVar6 = ((ws.m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              uVar9 = CONCAT44(ws.m_vsize._4_4_,(uint32_t)ws.m_vsize);
              uVar4 = *(undefined4 *)
                       ((long)ws.m_entry._M_t.
                              super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                              .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl + 0x98);
              IsCurrentForFeeEstimation(this->m_active_chainstate);
              CTxMemPool::HasNoInputsOf(this->m_pool,pCVar6);
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p =
                   (_Alloc_hider)
                   (pCVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length =
                   (size_type)
                   (pCVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  err_string.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  err_string.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_string_length)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       err_string.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_string_length)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  err_string.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_string_length)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       err_string.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_string_length)->_M_use_count + 1;
                }
              }
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._16_8_ = ws.m_base_fees;
              pCVar8 = this->m_pool;
              mempool_sequence = pCVar8->m_sequence_number;
              this_00 = (pCVar8->m_opts).signals;
              pCVar8->m_sequence_number = mempool_sequence + 1;
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._24_8_ = uVar9;
              err_string.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._32_4_ = uVar4;
              ValidationSignals::TransactionAddedToMempool
                        (this_00,(NewMempoolTransactionInfo *)&err_string,mempool_sequence);
              if (err_string.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_string_length != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           err_string.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_string_length);
              }
            }
            if ((this->m_subpackage).m_replaced_transactions.
                super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl._M_node.super__List_node_base._M_next !=
                (_List_node_base *)&(this->m_subpackage).m_replaced_transactions) {
              this_01 = LogInstance();
              bVar11 = BCLog::Logger::WillLogCategoryLevel(this_01,MEMPOOL,Debug);
              if (bVar11) {
                err_string.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p =
                     (_Alloc_hider)
                     (this->m_subpackage).m_replaced_transactions.
                     super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl._M_node._M_size;
                local_58._M_dataplus._M_p =
                     (pointer)(ws.m_modified_fees - (this->m_subpackage).m_conflicting_fees);
                local_528 = (char **)(CONCAT44(ws.m_vsize._4_4_,(uint32_t)ws.m_vsize) -
                                     (long)(int)(this->m_subpackage).m_conflicting_size);
                logging_function._M_str = "AcceptSingleTransaction";
                logging_function._M_len = 0x17;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ;
                source_file._M_len = 0x5e;
                LogPrintFormatInternal<unsigned_long,long,long>
                          (logging_function,source_file,0x5d8,MEMPOOL,Debug,
                           (ConstevalFormatString<3U>)0x810d78,(unsigned_long *)&err_string,
                           (long *)&local_58,(long *)&local_528);
              }
            }
          }
          MempoolAcceptResult::MempoolAcceptResult
                    (__return_storage_ptr__,&(this->m_subpackage).m_replaced_transactions,
                     CONCAT44(ws.m_vsize._4_4_,(uint32_t)ws.m_vsize),ws.m_base_fees,
                     effective_feerate,&single_wtxid);
        }
        else {
          local_490._0_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_mode;
          local_490._4_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_result;
          local_488 = local_478;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_488,
                     ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                     _M_dataplus._M_p,
                     ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                     _M_dataplus._M_p +
                     ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                     _M_string_length);
          local_468[0] = local_458;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_468,
                     ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                     _M_dataplus._M_p,
                     ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                     _M_dataplus._M_p +
                     ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                     _M_string_length);
          state_03.super_ValidationState<TxValidationResult>.m_result = uStack_574;
          state_03.super_ValidationState<TxValidationResult>.m_mode = local_578;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)__return_storage_ptr__;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_
               = local_568;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_
               = uStack_567;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = (size_type)local_560;
          state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
               local_558.nSatoshisPerK;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)local_550.nSatoshisPerK;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
               local_548.nSatoshisPerK;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity =
               (size_type)
               single_wtxid.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               single_wtxid.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          MempoolAcceptResult::Failure(__return_storage_ptr__,state_03);
          if (local_468[0] != local_458) {
            operator_delete(local_468[0],local_458[0] + 1);
          }
          local_310[0] = local_478[0];
          plVar15 = local_488;
          if (local_488 != local_478) goto LAB_003eb7c4;
        }
      }
      else {
        local_448._0_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_mode;
        local_448._4_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_result;
        local_440 = local_430;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_440,
                   ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                   _M_p,ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_dataplus._M_p +
                        ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_string_length);
        local_420[0] = local_410;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_420,
                   ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                   _M_p,ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_dataplus._M_p +
                        ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_string_length);
        state_02.super_ValidationState<TxValidationResult>.m_result = uStack_574;
        state_02.super_ValidationState<TxValidationResult>.m_mode = local_578;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)__return_storage_ptr__;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
             local_568;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
             uStack_567;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)local_560;
        state_02.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             local_558.nSatoshisPerK;
        state_02.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)local_550.nSatoshisPerK;
        state_02.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             local_548.nSatoshisPerK;
        state_02.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity =
             (size_type)
             single_wtxid.
             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        state_02.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
             single_wtxid.
             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        MempoolAcceptResult::Failure(__return_storage_ptr__,state_02);
        if (local_420[0] != local_410) {
          operator_delete(local_420[0],local_410[0] + 1);
        }
        local_310[0] = local_430[0];
        plVar15 = local_440;
        if (local_440 != local_430) goto LAB_003eb7c4;
      }
    }
  }
  else if (ws.m_state.super_ValidationState<TxValidationResult>.m_result == TX_RECONSIDERABLE) {
    local_2e0._0_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_mode;
    local_2e0._4_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_result;
    local_2d8 = local_2c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d8,
               ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
               ,ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                _M_p + ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                       _M_string_length);
    local_2b8[0] = local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2b8,
               ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p
               ,ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                _M_p + ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                       _M_string_length);
    CFeeRate::CFeeRate(&local_548,&ws.m_modified_fees,(uint32_t)ws.m_vsize);
    state_00.super_ValidationState<TxValidationResult>.m_result = uStack_574;
    state_00.super_ValidationState<TxValidationResult>.m_mode = local_578;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)__return_storage_ptr__;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
         local_568;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
         uStack_567;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)local_560;
    state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
         local_558.nSatoshisPerK;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)local_550.nSatoshisPerK;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
         local_548.nSatoshisPerK;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_allocated_capacity
         = (size_type)
           single_wtxid.
           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
         single_wtxid.
         super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    MempoolAcceptResult::FeeFailure
              (__return_storage_ptr__,state_00,(CFeeRate)local_2e0,
               (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                *)local_548.nSatoshisPerK);
    if (local_2b8[0] != local_2a8) {
      operator_delete(local_2b8[0],local_2a8[0] + 1);
    }
    local_310[0] = local_2c8[0];
    plVar15 = local_2d8;
    if (local_2d8 != local_2c8) goto LAB_003eb7c4;
  }
  else {
    local_328._0_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_mode;
    local_328._4_4_ = ws.m_state.super_ValidationState<TxValidationResult>.m_result;
    local_320 = local_310;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,
               ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
               ,ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                _M_p + ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                       _M_string_length);
    local_300[0] = local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,
               ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p
               ,ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                _M_p + ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                       _M_string_length);
    state_01.super_ValidationState<TxValidationResult>.m_result = uStack_574;
    state_01.super_ValidationState<TxValidationResult>.m_mode = local_578;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)__return_storage_ptr__;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_1_ =
         local_568;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_7_ =
         uStack_567;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)local_560;
    state_01.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
         local_558.nSatoshisPerK;
    state_01.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)local_550.nSatoshisPerK;
    state_01.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
         local_548.nSatoshisPerK;
    state_01.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_allocated_capacity
         = (size_type)
           single_wtxid.
           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    state_01.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
         single_wtxid.
         super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    MempoolAcceptResult::Failure(__return_storage_ptr__,state_01);
    if (local_300[0] != local_2f0) {
      operator_delete(local_300[0],local_2f0[0] + 1);
    }
    plVar15 = local_320;
    if (local_320 != local_310) goto LAB_003eb7c4;
  }
LAB_003eb7cc:
  if (single_wtxid.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(single_wtxid.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)single_wtxid.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)single_wtxid.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&ws.m_precomputed_txdata.m_spent_outputs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p !=
      &ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
    operator_delete(ws.m_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus
                    ._M_p,CONCAT71(ws.m_state.super_ValidationState<TxValidationResult>.
                                   m_debug_message.field_2._M_allocated_capacity._1_7_,
                                   ws.m_state.super_ValidationState<TxValidationResult>.
                                   m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p !=
      &ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
    operator_delete(ws.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus
                    ._M_p,CONCAT71(ws.m_state.super_ValidationState<TxValidationResult>.
                                   m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                   ws.m_state.super_ValidationState<TxValidationResult>.
                                   m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  if ((__uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>)
      ws.m_entry._M_t.super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>.
      _M_t.super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
      super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>)0x0) {
    std::default_delete<CTxMemPoolEntry>::operator()
              ((default_delete<CTxMemPoolEntry> *)&ws.m_entry,
               (CTxMemPoolEntry *)
               ws.m_entry._M_t.
               super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
               super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl);
  }
  ws.m_entry._M_t.super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t
  .super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
  super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl =
       (__uniq_ptr_data<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>,_true,_true>)
       (__uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>)0x0;
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&ws.m_ancestors._M_t);
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&ws.m_iters_conflicting._M_t);
  std::
  _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
               *)&ws);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(MempoolAcceptResult **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(MempoolAcceptResult **)(in_FS_OFFSET + 0x28);
  }
LAB_003ebde1:
  __stack_chk_fail();
}

Assistant:

MempoolAcceptResult MemPoolAccept::AcceptSingleTransaction(const CTransactionRef& ptx, ATMPArgs& args)
{
    AssertLockHeld(cs_main);
    LOCK(m_pool.cs); // mempool "read lock" (held through m_pool.m_opts.signals->TransactionAddedToMempool())

    Workspace ws(ptx);
    const std::vector<Wtxid> single_wtxid{ws.m_ptx->GetWitnessHash()};

    if (!PreChecks(args, ws)) {
        if (ws.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE) {
            // Failed for fee reasons. Provide the effective feerate and which tx was included.
            return MempoolAcceptResult::FeeFailure(ws.m_state, CFeeRate(ws.m_modified_fees, ws.m_vsize), single_wtxid);
        }
        return MempoolAcceptResult::Failure(ws.m_state);
    }

    // Individual modified feerate exceeded caller-defined max; abort
    if (args.m_client_maxfeerate && CFeeRate(ws.m_modified_fees, ws.m_vsize) > args.m_client_maxfeerate.value()) {
        ws.m_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "max feerate exceeded", "");
        return MempoolAcceptResult::Failure(ws.m_state);
    }

    if (m_subpackage.m_rbf && !ReplacementChecks(ws)) {
        if (ws.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE) {
            // Failed for incentives-based fee reasons. Provide the effective feerate and which tx was included.
            return MempoolAcceptResult::FeeFailure(ws.m_state, CFeeRate(ws.m_modified_fees, ws.m_vsize), single_wtxid);
        }
        return MempoolAcceptResult::Failure(ws.m_state);
    }

    // Perform the inexpensive checks first and avoid hashing and signature verification unless
    // those checks pass, to mitigate CPU exhaustion denial-of-service attacks.
    if (!PolicyScriptChecks(args, ws)) return MempoolAcceptResult::Failure(ws.m_state);

    if (!ConsensusScriptChecks(args, ws)) return MempoolAcceptResult::Failure(ws.m_state);

    const CFeeRate effective_feerate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
    // Tx was accepted, but not added
    if (args.m_test_accept) {
        return MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions), ws.m_vsize,
                                            ws.m_base_fees, effective_feerate, single_wtxid);
    }

    if (!Finalize(args, ws)) {
        // The only possible failure reason is fee-related (mempool full).
        // Failed for fee reasons. Provide the effective feerate and which txns were included.
        Assume(ws.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE);
        return MempoolAcceptResult::FeeFailure(ws.m_state, CFeeRate(ws.m_modified_fees, ws.m_vsize), {ws.m_ptx->GetWitnessHash()});
    }

    if (m_pool.m_opts.signals) {
        const CTransaction& tx = *ws.m_ptx;
        const auto tx_info = NewMempoolTransactionInfo(ws.m_ptx, ws.m_base_fees,
                                                       ws.m_vsize, ws.m_entry->GetHeight(),
                                                       args.m_bypass_limits, args.m_package_submission,
                                                       IsCurrentForFeeEstimation(m_active_chainstate),
                                                       m_pool.HasNoInputsOf(tx));
        m_pool.m_opts.signals->TransactionAddedToMempool(tx_info, m_pool.GetAndIncrementSequence());
    }

    if (!m_subpackage.m_replaced_transactions.empty()) {
        LogDebug(BCLog::MEMPOOL, "replaced %u mempool transactions with 1 new transaction for %s additional fees, %d delta bytes\n",
                 m_subpackage.m_replaced_transactions.size(),
                 ws.m_modified_fees - m_subpackage.m_conflicting_fees,
                 ws.m_vsize - static_cast<int>(m_subpackage.m_conflicting_size));
    }

    return MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions), ws.m_vsize, ws.m_base_fees,
                                        effective_feerate, single_wtxid);
}